

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void uv__udp_io(uv_loop_t *loop,uv__io_t *w,uint revents)

{
  uv__queue **handle;
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  undefined1 *puVar5;
  long lVar6;
  long lVar7;
  ssize_t sVar8;
  int iVar9;
  ulong uVar10;
  msghdr h;
  sockaddr_storage peer;
  mmsghdr msgs [20];
  iovec iov [20];
  sockaddr_in6 peers [20];
  uv_buf_t local_990;
  uint local_980;
  int local_97c;
  uv_buf_t local_978;
  msghdr local_968;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  mmsghdr local_8a8 [20];
  long local_3a8 [40];
  undefined1 local_268 [568];
  
  if (*(int *)&w[-2].watcher_queue.prev != 0xf) {
    __assert_fail("handle->type == UV_UDP",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                  ,0x8b,"void uv__udp_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  handle = &w[-2].pending_queue.prev;
  if ((revents & 1) != 0) {
    if (*(long *)&w[-1].fd == 0) {
      __assert_fail("handle->recv_cb != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                    ,0xdc,"void uv__udp_recvmsg(uv_udp_t *)");
    }
    lVar7._0_4_ = w[-1].pevents;
    lVar7._4_4_ = w[-1].events;
    if (lVar7 == 0) {
      __assert_fail("handle->alloc_cb != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                    ,0xdd,"void uv__udp_recvmsg(uv_udp_t *)");
    }
    iVar9 = 0x20;
    local_980 = revents;
    while( true ) {
      local_990 = uv_buf_init((char *)0x0,0);
      (**(code **)&w[-1].pevents)(handle,0x10000,&local_990);
      if ((local_990.base == (char *)0x0) || (local_990.len == 0)) break;
      if (((ulong)w[-1].pending_queue.prev & 0x4000000) == 0) {
        local_968.msg_control = (void *)0x0;
        local_968.msg_controllen = 0;
        local_968.msg_flags = 0;
        local_968._52_4_ = 0;
        local_928 = 0;
        uStack_920 = 0;
        local_918 = 0;
        uStack_910 = 0;
        local_908 = 0;
        uStack_900 = 0;
        local_8f8 = 0;
        uStack_8f0 = 0;
        local_8e8 = 0;
        uStack_8e0 = 0;
        local_8d8 = 0;
        uStack_8d0 = 0;
        local_8c8 = 0;
        uStack_8c0 = 0;
        local_8b8 = 0;
        uStack_8b0 = 0;
        local_968.msg_name = &local_928;
        local_968.msg_namelen = 0x80;
        local_968._12_4_ = 0;
        local_968.msg_iovlen = 1;
        local_968.msg_iov = (iovec *)&local_990;
        do {
          sVar2 = recvmsg(w->fd,&local_968,0);
          sVar8 = sVar2;
          if (sVar2 != -1) goto LAB_001f08ea;
          piVar3 = __errno_location();
          iVar1 = *piVar3;
        } while ((long)iVar1 == 4);
        if (iVar1 == 0xb) {
          sVar8 = 0;
        }
        else {
          sVar8 = -(long)iVar1;
        }
LAB_001f08ea:
        (**(code **)&w[-1].fd)(handle,sVar8,&local_990);
        iVar9 = iVar9 + -1;
      }
      else {
        uVar10 = local_990.len >> 0x10;
        if (0x13 < uVar10) {
          uVar10 = 0x14;
        }
        if (0xffff < local_990.len) {
          puVar5 = local_268;
          lVar7 = 0;
          pcVar4 = local_990.base;
          do {
            *(long *)((long)local_3a8 + lVar7) = (long)pcVar4;
            *(undefined8 *)((long)local_3a8 + lVar7 + 8) = 0x10000;
            *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_iov + lVar7 * 4) = 0;
            *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_iovlen + lVar7 * 4) = 0;
            *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_name + lVar7 * 4) = 0;
            *(undefined8 *)(&local_8a8[0].msg_hdr.msg_namelen + lVar7) = 0;
            *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_control + lVar7 * 4) = 0;
            *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_controllen + lVar7 * 4) = 0;
            *(undefined8 *)(&local_8a8[0].msg_hdr.msg_flags + lVar7) = 0;
            *(long **)((long)&local_8a8[0].msg_hdr.msg_iov + lVar7 * 4) =
                 (long *)((long)local_3a8 + lVar7);
            *(undefined8 *)((long)&local_8a8[0].msg_hdr.msg_iovlen + lVar7 * 4) = 1;
            *(undefined1 **)((long)&local_8a8[0].msg_hdr.msg_name + lVar7 * 4) = puVar5;
            (&local_8a8[0].msg_hdr.msg_namelen)[lVar7] = 0x1c;
            (&local_8a8[0].msg_hdr.msg_flags)[lVar7] = 0;
            lVar7 = lVar7 + 0x10;
            puVar5 = puVar5 + 0x1c;
            pcVar4 = pcVar4 + 0x10000;
          } while (uVar10 << 4 != lVar7);
        }
        do {
          iVar1 = recvmmsg(w->fd,local_8a8,(uint)uVar10,0,(timespec *)0x0);
          if (iVar1 != -1) break;
          piVar3 = __errno_location();
        } while (*piVar3 == 4);
        sVar2 = (ssize_t)iVar1;
        if (iVar1 < 1) {
          if (iVar1 == 0) {
LAB_001f08b5:
            lVar7 = 0;
          }
          else {
            piVar3 = __errno_location();
            if ((long)*piVar3 == 0xb) goto LAB_001f08b5;
            lVar7 = -(long)*piVar3;
          }
          (**(code **)&w[-1].fd)(handle,lVar7,&local_990);
        }
        else {
          lVar6 = 0;
          lVar7 = sVar2;
          local_97c = iVar9;
          do {
            if (*(long *)&w[-1].fd == 0) break;
            local_978 = uv_buf_init(*(char **)((long)local_3a8 + lVar6),
                                    *(size_t *)((long)local_3a8 + lVar6 + 8));
            (**(code **)&w[-1].fd)(handle,(&local_8a8[0].msg_len)[lVar6],&local_978);
            lVar6 = lVar6 + 0x10;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
          iVar9 = local_97c;
          revents = local_980;
          if (*(code **)&w[-1].fd != (code *)0x0) {
            (**(code **)&w[-1].fd)(handle,0,&local_990);
          }
        }
        if (iVar1 < 1) {
          iVar1 = 0;
        }
        iVar9 = iVar9 - iVar1;
      }
      if ((((sVar2 == -1) || (iVar9 < 1)) || (w->fd == -1)) || (*(long *)&w[-1].fd == 0))
      goto LAB_001f095d;
    }
    (**(code **)&w[-1].fd)(handle,0xffffffffffffff97,&local_990,0,0);
  }
LAB_001f095d:
  if (((revents & 4) != 0) && (((ulong)w[-1].pending_queue.prev & 3) == 0)) {
    uv__udp_sendmsg((uv_udp_t *)handle);
    uv__udp_run_completed((uv_udp_t *)handle);
  }
  return;
}

Assistant:

static void uv__udp_io(uv_loop_t* loop, uv__io_t* w, unsigned int revents) {
  uv_udp_t* handle;

  handle = container_of(w, uv_udp_t, io_watcher);
  assert(handle->type == UV_UDP);

  if (revents & POLLIN)
    uv__udp_recvmsg(handle);

  if (revents & POLLOUT && !uv__is_closing(handle)) {
    uv__udp_sendmsg(handle);
    uv__udp_run_completed(handle);
  }
}